

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Execute<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<double,_duckdb::hugeint_t> *state,double x_data,hugeint_t y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  long lVar2;
  uint64_t uVar3;
  
  lVar2 = y_data.upper;
  uVar3 = y_data.lower;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 0x10),
                     *(idx_t *)(lVar2 + 0x20));
  if (bVar1) {
    if (((long)*(uint64_t *)(this + 0x18) < (long)uVar3) ||
       (*(ArgMinMaxState<double,_duckdb::hugeint_t> **)(this + 0x10) < state &&
        *(uint64_t *)(this + 0x18) == uVar3)) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 8),
                         *(idx_t *)(lVar2 + 0x18));
      this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)!bVar1;
      if (bVar1) {
        *(double *)(this + 8) = x_data;
      }
      *(ArgMinMaxState<double,_duckdb::hugeint_t> **)(this + 0x10) = state;
      *(uint64_t *)(this + 0x18) = uVar3;
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}